

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

ArgumentSyntax * __thiscall slang::parsing::Parser::parseArgument(Parser *this)

{
  Token placeholder;
  Token name_00;
  Token dot_00;
  Token openParen;
  Token closeParen;
  bool bVar1;
  EmptyArgumentSyntax *pEVar2;
  __tuple_element_t<0UL,_tuple<Token,_Token,_PropertyExprSyntax_*>_> *p_Var3;
  __tuple_element_t<1UL,_tuple<Token,_Token,_PropertyExprSyntax_*>_> *p_Var4;
  NamedArgumentSyntax *pNVar5;
  OrderedArgumentSyntax *pOVar6;
  Info *in_RDI;
  Token TVar7;
  int in_stack_0000000c;
  Parser *in_stack_00000010;
  type *expr;
  type *innerCloseParen;
  type *innerOpenParen;
  Token name;
  Token dot;
  PropertyExprSyntax *in_stack_fffffffffffffef8;
  Info *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  TokenKind kind;
  ParserBase *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  ParserBase *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  ParserBase *in_stack_ffffffffffffff50;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffff88;
  ParserBase *in_stack_ffffffffffffff90;
  ParserBase *in_stack_ffffffffffffff98;
  Info *local_40;
  
  kind = (TokenKind)((ulong)in_stack_ffffffffffffff08 >> 0x30);
  bVar1 = ParserBase::peek(in_stack_ffffffffffffff10,kind);
  if ((!bVar1) && (bVar1 = ParserBase::peek(in_stack_ffffffffffffff10,kind), !bVar1)) {
    bVar1 = ParserBase::peek(in_stack_ffffffffffffff10,kind);
    if (!bVar1) {
      parsePropertyExpr(in_stack_00000010,in_stack_0000000c);
      pOVar6 = slang::syntax::SyntaxFactory::orderedArgument
                         ((SyntaxFactory *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      return &pOVar6->super_ArgumentSyntax;
    }
    ParserBase::consume(in_stack_ffffffffffffff20);
    TVar7 = ParserBase::expect(in_stack_ffffffffffffff90,
                               (TokenKind)((ulong)in_stack_ffffffffffffff88 >> 0x30));
    ParserBase::
    parseGroupOrSkip<slang::parsing::Parser::parseArgument()::__0,slang::syntax::PropertyExprSyntax*>
              (in_stack_ffffffffffffff98,(TokenKind)((ulong)in_RDI >> 0x30),
               (TokenKind)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff88);
    p_Var3 = std::
             get<0ul,slang::parsing::Token,slang::parsing::Token,slang::syntax::PropertyExprSyntax*>
                       ((tuple<slang::parsing::Token,_slang::parsing::Token,_slang::syntax::PropertyExprSyntax_*>
                         *)0x2ea488);
    p_Var4 = std::
             get<1ul,slang::parsing::Token,slang::parsing::Token,slang::syntax::PropertyExprSyntax*>
                       ((tuple<slang::parsing::Token,_slang::parsing::Token,_slang::syntax::PropertyExprSyntax_*>
                         *)0x2ea49d);
    std::get<2ul,slang::parsing::Token,slang::parsing::Token,slang::syntax::PropertyExprSyntax*>
              ((tuple<slang::parsing::Token,_slang::parsing::Token,_slang::syntax::PropertyExprSyntax_*>
                *)0x2ea4b2);
    local_40 = TVar7._0_8_;
    dot_00.info = in_RDI;
    dot_00.kind = (short)in_stack_ffffffffffffff28;
    dot_00._2_1_ = (char)((ulong)in_stack_ffffffffffffff28 >> 0x10);
    dot_00.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff28 >> 0x18);
    dot_00.rawLen = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
    name_00.info = (Info *)in_stack_ffffffffffffff20;
    name_00.kind = (short)in_stack_ffffffffffffff18;
    name_00._2_1_ = (char)((ulong)in_stack_ffffffffffffff18 >> 0x10);
    name_00.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff18 >> 0x18);
    name_00.rawLen = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
    openParen.info = *(Info **)p_Var3;
    openParen._0_8_ = p_Var4->info;
    closeParen.info = local_40;
    closeParen._0_8_ = p_Var3->info;
    pNVar5 = slang::syntax::SyntaxFactory::namedArgument
                       ((SyntaxFactory *)p_Var4->info,dot_00,name_00,openParen,
                        *(PropertyExprSyntax **)p_Var4,closeParen);
    return &pNVar5->super_ArgumentSyntax;
  }
  ParserBase::placeholderToken(in_stack_ffffffffffffff50);
  placeholder.info = in_stack_ffffffffffffff00;
  placeholder._0_8_ = in_stack_fffffffffffffef8;
  pEVar2 = slang::syntax::SyntaxFactory::emptyArgument((SyntaxFactory *)0x2ea3f1,placeholder);
  return &pEVar2->super_ArgumentSyntax;
}

Assistant:

ArgumentSyntax& Parser::parseArgument() {
    // check for empty arguments
    if (peek(TokenKind::Comma) || peek(TokenKind::CloseParenthesis))
        return factory.emptyArgument(placeholderToken());

    // check for named arguments
    if (peek(TokenKind::Dot)) {
        auto dot = consume();
        auto name = expect(TokenKind::Identifier);

        auto [innerOpenParen, innerCloseParen,
              expr] = parseGroupOrSkip(TokenKind::OpenParenthesis, TokenKind::CloseParenthesis,
                                       [this]() { return &parsePropertyExpr(0); });

        return factory.namedArgument(dot, name, innerOpenParen, expr, innerCloseParen);
    }

    return factory.orderedArgument(parsePropertyExpr(0));
}